

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O2

char absl::lts_20250127::str_format_internal::FormatConversionCharToChar(FormatConversionChar c)

{
  if (c < (v|s)) {
    return "csdiouxXfFeEgGaAnpv"[c];
  }
  return '\0';
}

Assistant:

inline char FormatConversionCharToChar(FormatConversionChar c) {
  if (c == FormatConversionCharInternal::kNone) {
    return '\0';

#define ABSL_INTERNAL_X_VAL(e)                       \
  } else if (c == FormatConversionCharInternal::e) { \
    return #e[0];
#define ABSL_INTERNAL_X_SEP
  ABSL_INTERNAL_CONVERSION_CHARS_EXPAND_(ABSL_INTERNAL_X_VAL,
                                         ABSL_INTERNAL_X_SEP)
  } else {
    return '\0';
  }

#undef ABSL_INTERNAL_X_VAL
#undef ABSL_INTERNAL_X_SEP
}